

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::enqueueObject(QPDFWriter *this,QPDFObjectHandle *object)

{
  int *piVar1;
  int iVar2;
  BaseDictionary *pBVar3;
  bool bVar4;
  QPDF *pQVar5;
  QPDFObjGen og;
  Object *pOVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  size_type sVar11;
  logic_error *this_00;
  element_type *peVar12;
  allocator<char> local_a2;
  allocator<char> local_a1;
  Dictionary d;
  QPDFObjectHandle local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  bVar4 = QPDFObjectHandle::isIndirect(object);
  if (bVar4) {
    pQVar5 = QPDFObjectHandle::getOwningQPDF(object);
    peVar12 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pQVar5 != peVar12->pdf) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "QPDFObjectHandle from different QPDF found while writing.  Use QPDF::copyForeignObject to add objects from another file."
                );
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (peVar12->qdf_mode == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&d,"/XRef",&local_a1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_a2);
      bVar4 = QPDFObjectHandle::isStreamOfType(object,(string *)&d,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&d);
      if (bVar4) {
        return;
      }
    }
    og = QPDFObjectHandle::getObjGen(object);
    pOVar6 = ObjTable<QPDFWriter::Object>::operator[]
                       (&(((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->obj).super_ObjTable<QPDFWriter::Object>,og);
    if (pOVar6->renumber != 0) {
      return;
    }
    if (pOVar6->object_stream < 1) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->object_queue,object);
      peVar12 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      iVar2 = peVar12->next_objid;
      peVar12->next_objid = iVar2 + 1;
      pOVar6->renumber = iVar2;
      if ((ulong)og >> 0x20 == 0) {
        d.super_BaseDictionary.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = og.obj;
        sVar11 = std::
                 map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
                 ::count(&peVar12->object_stream_to_objects,(key_type *)&d);
        peVar12 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (sVar11 != 0) {
          if (peVar12->linearized != false) {
            return;
          }
          assignCompressedObjectNumbers(this,og);
          return;
        }
      }
      if (peVar12->direct_stream_lengths != false) {
        return;
      }
      bVar4 = QPDFObjectHandle::isStream(object);
      if (!bVar4) {
        return;
      }
      piVar1 = &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->next_objid;
      *piVar1 = *piVar1 + 1;
      return;
    }
    pOVar6->renumber = -1;
    QPDF::getObject((QPDF *)&local_80,
                    (int)((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pdf,pOVar6->object_stream);
    enqueueObject(this,&local_80);
    pBVar3 = (BaseDictionary *)&local_80;
  }
  else {
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        linearized != false) {
      return;
    }
    bVar4 = QPDFObjectHandle::isArray(object);
    if (bVar4) {
      ::qpdf::Array::Array((Array *)&d,(shared_ptr<QPDFObject> *)object);
      iVar7 = ::qpdf::Array::begin((Array *)&d);
      iVar8 = ::qpdf::Array::end((Array *)&d);
      for (; iVar7._M_current != iVar8._M_current;
          iVar7._M_current =
               (QPDFObjectHandle *)
               ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar7._M_current + 1)) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar7._M_current);
        enqueueObject(this,(QPDFObjectHandle *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      }
      ::qpdf::Array::~Array((Array *)&d);
      return;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&d,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
    if (CONCAT44(d.super_BaseDictionary.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                 (int)d.super_BaseDictionary.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) != 0) {
      iVar9 = ::qpdf::BaseDictionary::begin_abi_cxx11_(&d.super_BaseDictionary);
      iVar10 = ::qpdf::BaseDictionary::end_abi_cxx11_(&d.super_BaseDictionary);
      for (; iVar9._M_node != iVar10._M_node;
          iVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node)) {
        bVar4 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar9._M_node + 2));
        if (!bVar4) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar9._M_node + 2));
          enqueueObject(this,(QPDFObjectHandle *)&local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        }
      }
    }
    pBVar3 = &d.super_BaseDictionary;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(pBVar3->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFWriter::enqueueObject(QPDFObjectHandle object)
{
    if (object.isIndirect()) {
        // This owner check can only be done for indirect objects. It is possible for a direct
        // object to have an owning QPDF that is from another file if a direct QPDFObjectHandle from
        // one file was insert into another file without copying. Doing that is safe even if the
        // original QPDF gets destroyed, which just disconnects the QPDFObjectHandle from its owner.
        if (object.getOwningQPDF() != &(m->pdf)) {
            QTC::TC("qpdf", "QPDFWriter foreign object");
            throw std::logic_error(
                "QPDFObjectHandle from different QPDF found while writing.  Use "
                "QPDF::copyForeignObject to add objects from another file.");
        }

        if (m->qdf_mode && object.isStreamOfType("/XRef")) {
            // As a special case, do not output any extraneous XRef streams in QDF mode. Doing so
            // will confuse fix-qdf, which expects to see only one XRef stream at the end of the
            // file. This case can occur when creating a QDF from a file with object streams when
            // preserving unreferenced objects since the old cross reference streams are not
            // actually referenced by object number.
            QTC::TC("qpdf", "QPDFWriter ignore XRef in qdf mode");
            return;
        }

        QPDFObjGen og = object.getObjGen();
        auto& obj = m->obj[og];

        if (obj.renumber == 0) {
            if (obj.object_stream > 0) {
                // This is in an object stream.  Don't process it here.  Instead, enqueue the object
                // stream.  Object streams always have generation 0.
                // Detect loops by storing invalid object ID -1, which will get overwritten later.
                obj.renumber = -1;
                enqueueObject(m->pdf.getObject(obj.object_stream, 0));
            } else {
                m->object_queue.push_back(object);
                obj.renumber = m->next_objid++;

                if ((og.getGen() == 0) && m->object_stream_to_objects.count(og.getObj())) {
                    // For linearized files, uncompressed objects go at end, and we take care of
                    // assigning numbers to them elsewhere.
                    if (!m->linearized) {
                        assignCompressedObjectNumbers(og);
                    }
                } else if ((!m->direct_stream_lengths) && object.isStream()) {
                    // reserve next object ID for length
                    ++m->next_objid;
                }
            }
        } else if (obj.renumber == -1) {
            // This can happen if a specially constructed file indicates that an object stream is
            // inside itself.
        }
        return;
    } else if (!m->linearized) {
        if (object.isArray()) {
            for (auto& item: object.as_array()) {
                enqueueObject(item);
            }
        } else if (auto d = object.as_dictionary()) {
            for (auto const& item: d) {
                if (!item.second.null()) {
                    enqueueObject(item.second);
                }
            }
        }
    } else {
        // ignore
    }
}